

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>::
find<kj::HashMap<kj::StringPtr,unsigned_short>::Entry_const,capnp::Text::Reader&>
          (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks> *this,
          ArrayPtr<const_kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> table,Reader *params)

{
  long lVar1;
  char *pcVar2;
  void *__s2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 __n;
  Entry *pEVar7;
  undefined8 *in_R8;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  Maybe<unsigned_long> MVar12;
  Maybe<unsigned_long> MVar13;
  ArrayPtr<const_unsigned_char> s;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  
  MVar12.ptr.field_1.value = table.size_;
  pEVar7 = table.ptr;
  if (pEVar7[1].key.content.ptr == (char *)0x0) {
    *this = (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>)0x0;
    MVar12.ptr._0_8_ = this;
    return (Maybe<unsigned_long>)MVar12.ptr;
  }
  s.size_ = in_R8[1] - 1;
  s.ptr = (uchar *)*in_R8;
  uVar4 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
  lVar1 = *(long *)&pEVar7->value;
  pcVar2 = pEVar7[1].key.content.ptr;
  uVar11 = (ulong)((int)pcVar2 - 1U & uVar4);
  uVar8 = *(uint *)(lVar1 + 4 + uVar11 * 8);
  __n = extraout_RDX;
  if (uVar8 != 0) {
    puVar6 = (uint *)(uVar11 * 8 + lVar1);
    __s2 = (void *)*in_R8;
    sVar3 = in_R8[1];
    do {
      if ((uVar8 != 1) && (*puVar6 == uVar4)) {
        uVar9 = (ulong)(uVar8 - 2);
        __n = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
              ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
              (MVar12.ptr.field_1.value + 8 + uVar9 * 0x18))->value;
        if (__n.value == sVar3) {
          if (__n.value != 0) {
            iVar5 = bcmp(*(void **)(uVar9 * 0x18 + MVar12.ptr.field_1.value),__s2,__n.value);
            __n = extraout_RDX_00;
            if (iVar5 != 0) goto LAB_0018c524;
          }
          *this = (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>)0x1;
          *(ulong *)(this + 8) = uVar9;
          goto LAB_0018c55d;
        }
      }
LAB_0018c524:
      pcVar10 = (char *)(uVar11 + 1);
      uVar11 = (ulong)pcVar10 & 0xffffffff;
      if (pcVar10 == pcVar2) {
        uVar11 = 0;
      }
      puVar6 = (uint *)(uVar11 * 8 + lVar1);
      uVar8 = puVar6[1];
    } while (uVar8 != 0);
  }
  *this = (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>)0x0;
LAB_0018c55d:
  MVar13.ptr.field_1.value = __n.value;
  MVar13.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar13.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }